

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O2

void __thiscall
axl::sl::ConstructSingleton<axl::sys::lnx::libudev::UdevLib>::operator()
          (ConstructSingleton<axl::sys::lnx::libudev::UdevLib> *this,void *p)

{
  Module *this_00;
  DestructSingleton<axl::sys::lnx::libudev::UdevLib> *p_00;
  Ptr<axl::g::Finalizer> local_20;
  
  sys::lnx::libudev::UdevLib::UdevLib((UdevLib *)p);
  this_00 = g::getModule();
  p_00 = (DestructSingleton<axl::sys::lnx::libudev::UdevLib> *)mem::allocate(0x28);
  (p_00->super_RefCount).m_refCount = 0;
  (p_00->super_RefCount).m_weakRefCount = 1;
  (p_00->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_0014ad10;
  (p_00->super_Finalizer)._vptr_Finalizer = (_func_int **)&DAT_0014ad38;
  p_00->m_p = (UdevLib *)p;
  (p_00->super_RefCount).m_freeFunc = mem::deallocate;
  rc::Ptr<axl::g::Finalizer>::Ptr<axl::sl::DestructSingleton<axl::sys::lnx::libudev::UdevLib>>
            (&local_20,p_00);
  g::Module::addFinalizer(this_00,&local_20);
  rc::Ptr<axl::g::Finalizer>::~Ptr(&local_20);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}